

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# requantize.cpp
# Opt level: O0

float ncnn::activation_ss(float v,int activation_type,Mat *activation_params)

{
  float fVar1;
  float *pfVar2;
  Mat *in_RSI;
  int in_EDI;
  float in_XMM0_Da;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float max;
  float min;
  float slope;
  undefined4 local_20;
  undefined4 local_4;
  undefined8 extraout_XMM0_Qb;
  
  if (in_EDI == 1) {
    dVar3 = std::fmax((double)(ulong)(uint)in_XMM0_Da,0.0);
    local_4 = SUB84(dVar3,0);
  }
  else if (in_EDI == 2) {
    pfVar2 = Mat::operator[](in_RSI,0);
    local_20 = in_XMM0_Da;
    if (in_XMM0_Da <= 0.0) {
      local_20 = in_XMM0_Da * *pfVar2;
    }
    local_4 = local_20;
  }
  else if (in_EDI == 3) {
    pfVar2 = Mat::operator[](in_RSI,0);
    fVar1 = *pfVar2;
    pfVar2 = Mat::operator[](in_RSI,1);
    local_4 = in_XMM0_Da;
    if (in_XMM0_Da < fVar1) {
      local_4 = fVar1;
    }
    if (*pfVar2 < local_4) {
      local_4 = *pfVar2;
    }
  }
  else if (in_EDI == 4) {
    dVar3 = std::exp((double)(ulong)(uint)-in_XMM0_Da);
    local_4 = 1.0 / (SUB84(dVar3,0) + 1.0);
  }
  else {
    local_4 = in_XMM0_Da;
    if (in_EDI == 5) {
      auVar4._0_8_ = std::exp((double)(ulong)(uint)in_XMM0_Da);
      auVar4._8_8_ = extraout_XMM0_Qb;
      auVar5._4_12_ = auVar4._4_12_;
      auVar5._0_4_ = SUB84(auVar4._0_8_,0) + 1.0;
      dVar3 = std::log(auVar5._0_8_);
      dVar3 = std::tanh(dVar3);
      local_4 = in_XMM0_Da * SUB84(dVar3,0);
    }
  }
  return local_4;
}

Assistant:

static inline float activation_ss(float v, int activation_type, const ncnn::Mat& activation_params)
{
    if (activation_type == 1)
    {
        v = fmax(v, 0.f);
    }
    else if (activation_type == 2)
    {
        float slope = activation_params[0];
        v = v > 0.f ? v : v * slope;
    }
    else if (activation_type == 3)
    {
        float min = activation_params[0];
        float max = activation_params[1];
        if (v < min)
            v = min;
        if (v > max)
            v = max;
    }
    else if (activation_type == 4)
    {
        v = 1.f / (1.f + exp(-v));
    }
    else if (activation_type == 5)
    {
        v = v * tanh(log(exp(v) + 1.f));
    }

    return v;
}